

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::detail::logAssertNothrow(bool threw,char *expr,Enum assert_type,char *file,int line)

{
  char *pcVar1;
  Code code;
  undefined7 in_register_00000039;
  Color *pCVar2;
  char msg [1024];
  char info1 [1024];
  char loc [1024];
  String local_c60;
  String local_c58;
  String local_c50;
  String local_c48;
  String local_c40;
  undefined8 local_c38;
  undefined2 local_c30;
  Color local_838 [1024];
  char local_438 [1032];
  
  pcVar1 = fileForOutput(file);
  snprintf(local_438,0x400,"%s(%d)",pcVar1,(ulong)(uint)line);
  if ((int)CONCAT71(in_register_00000039,threw) == 0) {
    local_c38 = 0x2144455353415020;
  }
  else {
    local_c38 = 0x2144454c49414620;
  }
  local_c30 = 10;
  pcVar1 = getAssertString(assert_type);
  pCVar2 = local_838;
  snprintf((char *)pCVar2,0x400,"  %s( %s )\n\n",pcVar1,expr);
  if (local_438[0] != '\0') {
    Color::use(pCVar2,LightGrey);
    pCVar2 = (Color *)0x14c3de;
    printf("%s");
    Color::use(pCVar2,None);
  }
  code = BrightGreen;
  if (threw) {
    code = Red;
  }
  Color::use(pCVar2,code);
  pCVar2 = (Color *)0x14c3de;
  printf("%s");
  Color::use(pCVar2,None);
  if (local_838[0] != (Color)0x0) {
    Color::use(pCVar2,Cyan);
    pCVar2 = (Color *)0x14c3de;
    printf("%s");
    Color::use(pCVar2,None);
  }
  String::String(&local_c50,local_438);
  String::String(&local_c58,(char *)&local_c38);
  String::operator+(&local_c48,&local_c50);
  String::String(&local_c60,(char *)local_838);
  String::operator+(&local_c40,&local_c48);
  free(local_c40.m_str);
  free(local_c60.m_str);
  free(local_c48.m_str);
  free(local_c58.m_str);
  free(local_c50.m_str);
  return;
}

Assistant:

void logAssertNothrow(bool threw, const char* expr, assertType::Enum assert_type,
                          const char* file, int line) {
        char loc[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(loc, DOCTEST_COUNTOF(loc), "%s(%d)", fileForOutput(file), line);

        char msg[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        if(!threw)
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " PASSED!\n");
        else
            DOCTEST_SNPRINTF(msg, DOCTEST_COUNTOF(msg), " FAILED!\n");

        char info1[DOCTEST_SNPRINTF_BUFFER_LENGTH];
        DOCTEST_SNPRINTF(info1, DOCTEST_COUNTOF(info1), "  %s( %s )\n\n",
                         getAssertString(assert_type), expr);

        DOCTEST_PRINTF_COLORED(loc, Color::LightGrey);
        DOCTEST_PRINTF_COLORED(msg, !threw ? Color::BrightGreen : Color::Red);
        DOCTEST_PRINTF_COLORED(info1, Color::Cyan);

        printToDebugConsole(String(loc) + msg + info1);
    }